

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::OptionParser(OptionParser *this,char *program_name,char *description)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,program_name,(allocator<char> *)local_38._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->description_,description,(allocator<char> *)local_38._M_pod_data);
  *(undefined8 *)&(this->on_error_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_error_).super__Function_base._M_functor + 8) = 0;
  (this->arguments_).
  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments_).
  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).
  super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arguments_).
  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).
  super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).
  super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(OptionParser **)&(this->on_error_).super__Function_base._M_functor = this;
  (this->on_error_)._M_invoker =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/option-parser.cc:48:17)>
       ::_M_invoke;
  (this->on_error_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/option-parser.cc:48:17)>
       ::_M_manager;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/option-parser.cc:50:48)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/option-parser.cc:50:48)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  AddOption(this,"help","Print this help message",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/option-parser.cc:54:53)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/option-parser.cc:54:53)>
             ::_M_manager;
  AddOption(this,"version","Print version information",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

OptionParser::OptionParser(const char* program_name, const char* description)
    : program_name_(program_name),
      description_(description),
      on_error_([this](const std::string& message) { DefaultError(message); }) {
  // Add common options
  AddOption("help", "Print this help message", [this]() {
    PrintHelp();
    exit(0);
  });
  AddOption("version", "Print version information", []() {
    printf("%s\n", WABT_VERSION_STRING);
    exit(0);
  });
}